

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp0_helper.c
# Opt level: O3

void helper_mtc0_index_mipsel(CPUMIPSState_conflict2 *env,target_ulong_conflict arg1)

{
  uint uVar1;
  
  uVar1 = arg1 & 0x7fffffff;
  if (uVar1 < env->tlb->nb_tlb) {
    if (((uint)env->insn_flags >> 0xd & 1) == 0) {
      arg1 = 0;
    }
    env->CP0_Index = (arg1 | env->CP0_Index) & 0x80000000 | uVar1;
  }
  return;
}

Assistant:

void helper_mtc0_index(CPUMIPSState *env, target_ulong arg1)
{
    uint32_t index_p = env->CP0_Index & 0x80000000;
    uint32_t tlb_index = arg1 & 0x7fffffff;
    if (tlb_index < env->tlb->nb_tlb) {
        if (env->insn_flags & ISA_MIPS32R6) {
            index_p |= arg1 & 0x80000000;
        }
        env->CP0_Index = index_p | tlb_index;
    }
}